

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O0

void helper_crypto_sm4e_aarch64(void *vd,void *vn)

{
  uint uVar1;
  uint32_t word;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint local_50;
  uint32_t i;
  uint32_t t;
  CRYPTO_STATE n;
  CRYPTO_STATE d;
  uint64_t *rn;
  uint64_t *rd;
  void *vn_local;
  void *vd_local;
  
  vn_local = vd;
  rd = (uint64_t *)vn;
  rn = (uint64_t *)vd;
  d.l[1] = (uint64_t)vn;
  n.l[1] = *vd;
  d.l[0] = *(uint64_t *)((long)vd + 8);
  _i = *vn;
  n.l[0] = *(uint64_t *)((long)vn + 8);
  for (local_50 = 0; local_50 < 4; local_50 = local_50 + 1) {
    uVar1 = *(uint *)((long)&n + (ulong)(local_50 + 1 & 3) * 4 + 8) ^
            *(uint *)((long)&n + (ulong)(local_50 + 2 & 3) * 4 + 8) ^
            *(uint *)((long)&n + (ulong)(local_50 + 3 & 3) * 4 + 8) ^ (&i)[local_50];
    word = CONCAT13(sm4_sbox[uVar1 >> 0x18],
                    CONCAT12(sm4_sbox[uVar1 >> 0x10 & 0xff],
                             CONCAT11(sm4_sbox[uVar1 >> 8 & 0xff],sm4_sbox[uVar1 & 0xff])));
    uVar2 = rol32(word,2);
    uVar3 = rol32(word,10);
    uVar4 = rol32(word,0x12);
    uVar5 = rol32(word,0x18);
    *(uint32_t *)((long)&n + (ulong)local_50 * 4 + 8) =
         word ^ uVar2 ^ uVar3 ^ uVar4 ^ uVar5 ^ *(uint *)((long)&n + (ulong)local_50 * 4 + 8);
  }
  *rn = n.l[1];
  rn[1] = d.l[0];
  return;
}

Assistant:

void HELPER(crypto_sm4e)(void *vd, void *vn)
{
    uint64_t *rd = vd;
    uint64_t *rn = vn;
    union CRYPTO_STATE d = { .l = { rd[0], rd[1] } };
    union CRYPTO_STATE n = { .l = { rn[0], rn[1] } };
    uint32_t t, i;

    for (i = 0; i < 4; i++) {
        t = CR_ST_WORD(d, (i + 1) % 4) ^
            CR_ST_WORD(d, (i + 2) % 4) ^
            CR_ST_WORD(d, (i + 3) % 4) ^
            CR_ST_WORD(n, i);

        t = sm4_sbox[t & 0xff] |
            sm4_sbox[(t >> 8) & 0xff] << 8 |
            sm4_sbox[(t >> 16) & 0xff] << 16 |
            sm4_sbox[(t >> 24) & 0xff] << 24;

        CR_ST_WORD(d, i) ^= t ^ rol32(t, 2) ^ rol32(t, 10) ^ rol32(t, 18) ^
                            rol32(t, 24);
    }

    rd[0] = d.l[0];
    rd[1] = d.l[1];
}